

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::CheckArgument(cmCTest *this,string *arg,string_view varg1,char *varg2)

{
  int iVar1;
  bool bVar2;
  
  if (this[1].Impl._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl == (Private *)arg) {
    if (arg == (string *)0x0) {
      return true;
    }
    iVar1 = bcmp((this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl,(void *)varg1._M_len,
                 (size_t)arg);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (varg1._M_str == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)this);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool cmCTest::CheckArgument(const std::string& arg, cm::string_view varg1,
                            const char* varg2)
{
  return (arg == varg1) || (varg2 && arg == varg2);
}